

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::RenderTextClipped
               (ImVec2 *pos_min,ImVec2 *pos_max,char *text,char *text_end,ImVec2 *text_size_if_known
               ,ImVec2 *align,ImRect *clip_rect)

{
  ImGuiContext *pIVar1;
  char *text_display_end_00;
  ImGuiWindow *window;
  ImGuiContext *g;
  int text_len;
  char *text_display_end;
  ImVec2 *align_local;
  ImVec2 *text_size_if_known_local;
  char *text_end_local;
  char *text_local;
  ImVec2 *pos_max_local;
  ImVec2 *pos_min_local;
  
  text_display_end_00 = FindRenderedTextEnd(text,text_end);
  pIVar1 = GImGui;
  if (((int)text_display_end_00 != (int)text) &&
     (RenderTextClippedEx(GImGui->CurrentWindow->DrawList,pos_min,pos_max,text,text_display_end_00,
                          text_size_if_known,align,clip_rect), (pIVar1->LogEnabled & 1U) != 0)) {
    LogRenderedText(pos_min,text,text_display_end_00);
  }
  return;
}

Assistant:

void ImGui::RenderTextClipped(const ImVec2& pos_min, const ImVec2& pos_max, const char* text, const char* text_end, const ImVec2* text_size_if_known, const ImVec2& align, const ImRect* clip_rect)
{
    // Hide anything after a '##' string
    const char* text_display_end = FindRenderedTextEnd(text, text_end);
    const int text_len = (int)(text_display_end - text);
    if (text_len == 0)
        return;

    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    RenderTextClippedEx(window->DrawList, pos_min, pos_max, text, text_display_end, text_size_if_known, align, clip_rect);
    if (g.LogEnabled)
        LogRenderedText(&pos_min, text, text_display_end);
}